

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O2

RPCHelpMan * wallet::getunconfirmedbalance(void)

{
  string m_key_name;
  RPCResult result;
  string description;
  string description_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  RPCMethodImpl fun;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  _Manager_type in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffe38;
  pointer pRVar1;
  pointer pRVar2;
  pointer pRVar3;
  _Vector_impl_data in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe78 [16];
  pointer pRVar4;
  pointer pRVar5;
  pointer pRVar6;
  undefined8 in_stack_fffffffffffffea0;
  undefined1 *in_stack_fffffffffffffea8;
  undefined1 local_148 [8];
  undefined8 uStack_140;
  undefined1 *local_138 [2];
  undefined1 local_128 [8];
  undefined8 uStack_120;
  string local_118 [32];
  string local_f8 [32];
  RPCResult local_d8;
  string local_50 [32];
  string local_30 [32];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"getunconfirmedbalance",(allocator<char> *)&stack0xfffffffffffffea7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"DEPRECATED\nIdentical to getbalances().mine.untrusted_pending\n",
             (allocator<char> *)&stack0xfffffffffffffea6);
  pRVar4 = (pointer)0x0;
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"",(allocator<char> *)&stack0xfffffffffffffe6f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_118,"The balance",(allocator<char> *)&stack0xfffffffffffffe6e);
  pRVar1 = (pointer)0x0;
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffffe10;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe08;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffe18;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffffe20;
  description._M_string_length = in_stack_fffffffffffffe30;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe28;
  description.field_2 = in_stack_fffffffffffffe38;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_d8,NUM,m_key_name,description,inner,SUB81(local_f8,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe10;
  result._0_8_ = in_stack_fffffffffffffe08;
  result.m_key_name._M_string_length = in_stack_fffffffffffffe18;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffe20;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffffe28;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe30;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffffe38;
  result._64_8_ = pRVar1;
  result.m_description._M_dataplus._M_p = (pointer)pRVar2;
  result.m_description._M_string_length = (size_type)pRVar3;
  result._88_24_ = in_stack_fffffffffffffe60;
  result.m_cond._8_16_ = in_stack_fffffffffffffe78;
  result.m_cond.field_2._8_8_ = pRVar4;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffffe70,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffea8,"",(allocator<char> *)&stack0xfffffffffffffe47);
  local_138[0] = in_stack_fffffffffffffea8;
  if (in_stack_fffffffffffffea8 == local_148) {
    uStack_120 = uStack_140;
    local_138[0] = local_128;
  }
  local_148[0] = 0;
  description_00._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/coins.cpp:222:9)>
       ::_M_invoke;
  description_00._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/coins.cpp:222:9)>
                ::_M_manager;
  description_00.field_2 = in_stack_fffffffffffffe38;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar1;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar3;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar4;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe78._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffffe78._8_8_;
  examples.m_examples.field_2._8_8_ = pRVar5;
  fun.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffea0;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar6;
  fun.super__Function_base._M_manager = (_Manager_type)local_148;
  fun._M_invoker = (_Invoker_type)0x0;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffffe10,&stack0xfffffffffffffe18)),
             description_00,args,(RPCResults)in_stack_fffffffffffffe60,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffe18);
  std::__cxx11::string::~string((string *)local_138);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffea8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffe70);
  RPCResult::~RPCResult(&local_d8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffe48);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_f8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffe88);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

RPCHelpMan getunconfirmedbalance()
{
    return RPCHelpMan{"getunconfirmedbalance",
                "DEPRECATED\nIdentical to getbalances().mine.untrusted_pending\n",
                {},
                RPCResult{RPCResult::Type::NUM, "", "The balance"},
                RPCExamples{""},
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    pwallet->BlockUntilSyncedToCurrentChain();

    LOCK(pwallet->cs_wallet);

    return ValueFromAmount(GetBalance(*pwallet).m_mine_untrusted_pending);
},
    };
}